

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_ddict.c
# Opt level: O3

size_t ZSTD_freeDDict(ZSTD_DDict *ddict)

{
  ZSTD_freeFunction p_Var1;
  void *pvVar2;
  void *__ptr;
  
  if (ddict == (ZSTD_DDict *)0x0) {
    return 0;
  }
  p_Var1 = (ddict->cMem).customFree;
  pvVar2 = (ddict->cMem).opaque;
  __ptr = ddict->dictBuffer;
  if (__ptr == (void *)0x0) {
    if (p_Var1 != (ZSTD_freeFunction)0x0) goto LAB_0021ff48;
  }
  else {
    if (p_Var1 != (ZSTD_freeFunction)0x0) {
      (*p_Var1)(pvVar2,__ptr);
LAB_0021ff48:
      (*p_Var1)(pvVar2,ddict);
      return 0;
    }
    free(__ptr);
  }
  free(ddict);
  return 0;
}

Assistant:

size_t ZSTD_freeDDict(ZSTD_DDict* ddict)
{
    if (ddict==NULL) return 0;   /* support free on NULL */
    {   ZSTD_customMem const cMem = ddict->cMem;
        ZSTD_customFree(ddict->dictBuffer, cMem);
        ZSTD_customFree(ddict, cMem);
        return 0;
    }
}